

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O1

BOOL Js::JavascriptArray::TryTemplatedGetItem<Js::TypedArrayBase,unsigned_int>
               (RecyclableObject *arr,uint index,Var *element,ScriptContext *scriptContext,
               bool checkHasItem)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  undefined4 extraout_var;
  
  bVar1 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(arr);
  if (!bVar1) {
    BVar3 = JavascriptOperators::GetItem(arr,index,element,scriptContext);
    return BVar3;
  }
  if ((checkHasItem) &&
     (iVar2 = (*(arr->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x24])(arr,(ulong)index), iVar2 != 1)) {
    return 0;
  }
  iVar2 = (*(arr->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x72])(arr,(ulong)index);
  *element = (Var)CONCAT44(extraout_var,iVar2);
  return 1;
}

Assistant:

static BOOL TryTemplatedGetItem(RecyclableObject* arr, P index, Var *element, ScriptContext *scriptContext, bool checkHasItem = true)
        {
            return VarIsWithoutES5Array<T>(arr) ? JavascriptArray::TemplatedGetItem(static_cast<T*>(arr), index, element, scriptContext, checkHasItem) :
                JavascriptOperators::GetItem(arr, index, element, scriptContext);
        }